

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O1

int al_get_ram_size(void)

{
  long lVar1;
  long lVar2;
  
  lVar1 = sysconf(0x55);
  lVar2 = sysconf(0x1e);
  return (int)((ulong)(lVar2 * lVar1) >> 0x14);
}

Assistant:

int al_get_ram_size(void)
{
#if defined(ALLEGRO_HAVE_SYSCONF) && defined(_SC_PHYS_PAGES) && defined(_SC_PAGESIZE)
   uint64_t aid = (uint64_t) sysconf(_SC_PHYS_PAGES);
   aid         *= (uint64_t) sysconf(_SC_PAGESIZE);
   aid         /= (uint64_t) (1024 * 1024);
   return (int)(aid);
#elif defined(ALLEGRO_HAVE_SYSCTL)
   #ifdef HW_REALMEM
      int mib[2] = {CTL_HW, HW_REALMEM};
   #elif defined(HW_PHYSMEM)
      int mib[2] = {CTL_HW, HW_PHYSMEM};
   #elif defined(HW_MEMSIZE)
      int mib[2] = {CTL_HW, HW_MEMSIZE};
   #else
      return -1;
   #endif
   uint64_t memsize = 0;
   size_t len = sizeof(memsize);
   if (sysctl(mib, 2, &memsize, &len, NULL, 0) == 0) { 
      return (int)(memsize / (1024*1024));
   }
#elif defined(ALLEGRO_WINDOWS)
   MEMORYSTATUSEX status;
   status.dwLength = sizeof(status);
   if (GlobalMemoryStatusEx(&status)) {
      return (int)(status.ullTotalPhys / (1024 * 1024));
   }
#endif
   return -1;
}